

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O0

int __thiscall
crnlib::static_huffman_data_model::init(static_huffman_data_model *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  bool bVar2;
  uint table_bits;
  void *pContext;
  uchar *puVar3;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  unsigned_short *pCodes;
  undefined7 extraout_var_01;
  decoder_tables *pdVar4;
  undefined7 extraout_var_02;
  undefined7 uVar5;
  uint16 *in_RCX;
  uint in_EDX;
  uint in_R8D;
  uint local_40;
  uint uStack_3c;
  bool status;
  uint total_freq;
  uint max_code_size;
  void *pTables;
  uint16 *puStack_28;
  uint code_size_limit_local;
  uint16 *pSym_freq_local;
  uint total_syms_local;
  bool encoding_local;
  static_huffman_data_model *this_local;
  
  pSym_freq_local._7_1_ = (byte)ctx & 1;
  this->m_encoding = (bool)pSym_freq_local._7_1_;
  this->m_total_syms = in_EDX;
  puStack_28 = in_RCX;
  pSym_freq_local._0_4_ = in_EDX;
  _total_syms_local = this;
  pTables._4_4_ = math::minimum<unsigned_int>(in_R8D,0x10);
  vector<unsigned_char>::resize(&this->m_code_sizes,(uint)pSym_freq_local,false);
  pContext = create_generate_huffman_codes_tables();
  uStack_3c = 0;
  uVar1 = this->m_total_syms;
  _total_freq = pContext;
  puVar3 = vector<unsigned_char>::operator[](&this->m_code_sizes,0);
  bVar2 = generate_huffman_codes
                    (pContext,uVar1,puStack_28,puVar3,&stack0xffffffffffffffc4,&local_40);
  free_generate_huffman_codes_tables(_total_freq);
  if (bVar2) {
    if (pTables._4_4_ < uStack_3c) {
      uVar1 = this->m_total_syms;
      puVar3 = vector<unsigned_char>::operator[](&this->m_code_sizes,0);
      bVar2 = prefix_coding::limit_max_code_size(uVar1,puVar3,pTables._4_4_);
      if (!bVar2) {
        this_local._7_1_ = 0;
        uVar5 = extraout_var_00;
        goto LAB_002123f3;
      }
    }
    if ((this->m_encoding & 1U) == 0) {
      vector<unsigned_short>::clear(&this->m_codes);
      if (this->m_pDecode_tables == (decoder_tables *)0x0) {
        pdVar4 = crnlib_new<crnlib::prefix_coding::decoder_tables>();
        this->m_pDecode_tables = pdVar4;
      }
      uVar1 = this->m_total_syms;
      puVar3 = vector<unsigned_char>::operator[](&this->m_code_sizes,0);
      pdVar4 = this->m_pDecode_tables;
      table_bits = compute_decoder_table_bits(this);
      bVar2 = prefix_coding::generate_decoder_tables(uVar1,puVar3,pdVar4,table_bits);
      uVar5 = extraout_var_02;
      if (!bVar2) {
        this_local._7_1_ = 0;
        goto LAB_002123f3;
      }
    }
    else {
      vector<unsigned_short>::resize(&this->m_codes,(uint)pSym_freq_local,false);
      if (this->m_pDecode_tables != (decoder_tables *)0x0) {
        crnlib_delete<crnlib::prefix_coding::decoder_tables>(this->m_pDecode_tables);
        this->m_pDecode_tables = (decoder_tables *)0x0;
      }
      uVar1 = this->m_total_syms;
      puVar3 = vector<unsigned_char>::operator[](&this->m_code_sizes,0);
      pCodes = vector<unsigned_short>::operator[](&this->m_codes,0);
      bVar2 = prefix_coding::generate_codes(uVar1,puVar3,pCodes);
      uVar5 = extraout_var_01;
      if (!bVar2) {
        this_local._7_1_ = 0;
        goto LAB_002123f3;
      }
    }
    this_local._7_1_ = 1;
  }
  else {
    this_local._7_1_ = 0;
    uVar5 = extraout_var;
  }
LAB_002123f3:
  return (int)CONCAT71(uVar5,this_local._7_1_);
}

Assistant:

bool static_huffman_data_model::init(bool encoding, uint total_syms, const uint16* pSym_freq, uint code_size_limit)
    {
        CRNLIB_ASSERT((total_syms >= 1) && (total_syms <= prefix_coding::cMaxSupportedSyms) && (code_size_limit >= 1));

        m_encoding = encoding;

        m_total_syms = total_syms;

        code_size_limit = math::minimum(code_size_limit, prefix_coding::cMaxExpectedCodeSize);

        m_code_sizes.resize(total_syms);

        void* pTables = create_generate_huffman_codes_tables();

        uint max_code_size = 0, total_freq;
        bool status = generate_huffman_codes(pTables, m_total_syms, pSym_freq, &m_code_sizes[0], max_code_size, total_freq);

        free_generate_huffman_codes_tables(pTables);

        if (!status)
        {
            return false;
        }

        if (max_code_size > code_size_limit)
        {
            if (!prefix_coding::limit_max_code_size(m_total_syms, &m_code_sizes[0], code_size_limit))
            {
                return false;
            }
        }

        if (m_encoding)
        {
            m_codes.resize(total_syms);

            if (m_pDecode_tables)
            {
                crnlib_delete(m_pDecode_tables);
                m_pDecode_tables = nullptr;
            }

            if (!prefix_coding::generate_codes(m_total_syms, &m_code_sizes[0], &m_codes[0]))
            {
                return false;
            }
        }
        else
        {
            m_codes.clear();

            if (!m_pDecode_tables)
            {
                m_pDecode_tables = crnlib_new<prefix_coding::decoder_tables>();
            }

            if (!prefix_coding::generate_decoder_tables(m_total_syms, &m_code_sizes[0], m_pDecode_tables, compute_decoder_table_bits()))
            {
                return false;
            }
        }

        return true;
    }